

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symtab.c
# Opt level: O3

int symtab_get(symtab *tab,char *name,int *ptype,int *pdata)

{
  symtab_sym *psVar1;
  int *piVar2;
  symtab_sym *psVar3;
  uint32_t uVar4;
  int iVar5;
  int iVar6;
  
  piVar2 = tab->buckets;
  uVar4 = elf_hash(name);
  iVar6 = piVar2[(ulong)uVar4 % (ulong)(uint)tab->bucketsnum];
  if (iVar6 != -1) {
    psVar3 = tab->syms;
    do {
      psVar1 = psVar3 + iVar6;
      iVar5 = strcmp(psVar1->name,name);
      if (iVar5 == 0) {
        if (ptype != (int *)0x0) {
          *ptype = psVar1->type;
        }
        if (pdata == (int *)0x0) {
          return iVar6;
        }
        *pdata = psVar3[iVar6].data;
        return iVar6;
      }
      iVar6 = psVar1->hchain;
    } while (iVar6 != -1);
  }
  return -1;
}

Assistant:

int symtab_get(struct symtab *tab, const char *name, int *ptype, int *pdata) {
	int i = tab->buckets[elf_hash(name) % tab->bucketsnum];
	while (i != -1) {
		if (!strcmp(tab->syms[i].name, name)) {
			if (ptype)
				*ptype = tab->syms[i].type;
			if (pdata)
				*pdata = tab->syms[i].data;
			return i;
		}
		i = tab->syms[i].hchain;
	}
	return -1;
}